

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall btRaycastVehicle::debugDraw(btRaycastVehicle *this,btIDebugDraw *debugDrawer)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  btWheelInfo *pbVar4;
  btVector3 *pbVar5;
  btMatrix3x3 *pbVar6;
  btVector3 *pbVar7;
  btVector3 *this_00;
  btScalar *pbVar8;
  long *in_RSI;
  btRaycastVehicle *in_RDI;
  btVector3 bVar9;
  btVector3 axle;
  btVector3 wheelPosWS;
  btVector3 wheelColor;
  int v;
  btScalar *in_stack_ffffffffffffff38;
  int index;
  btRaycastVehicle *in_stack_ffffffffffffff40;
  undefined8 local_78;
  undefined8 local_70;
  btVector3 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btVector3 local_24;
  int local_14;
  long *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while( true ) {
    iVar3 = local_14;
    index = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    iVar2 = getNumWheels((btRaycastVehicle *)0x236054);
    if (iVar2 <= iVar3) break;
    local_28 = 0.0;
    local_2c = 1.0;
    local_30 = 1.0;
    btVector3::btVector3(&local_24,&local_28,&local_2c,&local_30);
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,index);
    if (((pbVar4->m_raycastInfo).m_isInContact & 1U) == 0) {
      local_40 = 1.0;
      local_44 = 0.0;
      local_48 = 1.0;
      btVector3::setValue(&local_24,&local_40,&local_44,&local_48);
    }
    else {
      local_34 = 0.0;
      local_38 = 0.0;
      local_3c = 1.0;
      btVector3::setValue(&local_24,&local_34,&local_38,&local_3c);
    }
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,index);
    pbVar5 = btTransform::getOrigin(&pbVar4->m_worldTransform);
    local_58 = *(undefined8 *)pbVar5->m_floats;
    uStack_50 = *(undefined8 *)(pbVar5->m_floats + 2);
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,index);
    pbVar6 = btTransform::getBasis(&pbVar4->m_worldTransform);
    pbVar5 = btMatrix3x3::operator[](pbVar6,0);
    in_stack_ffffffffffffff38 = btVector3::operator_cast_to_float_(pbVar5);
    iVar3 = getRightAxis(in_RDI);
    pbVar5 = (btVector3 *)(in_stack_ffffffffffffff38 + iVar3);
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20))
    ;
    pbVar6 = btTransform::getBasis(&pbVar4->m_worldTransform);
    pbVar7 = btMatrix3x3::operator[](pbVar6,1);
    in_stack_ffffffffffffff40 = (btRaycastVehicle *)btVector3::operator_cast_to_float_(pbVar7);
    iVar3 = getRightAxis(in_RDI);
    pbVar7 = (btVector3 *)
             ((long)&(in_stack_ffffffffffffff40->super_btActionInterface)._vptr_btActionInterface +
             (long)iVar3 * 4);
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20))
    ;
    pbVar6 = btTransform::getBasis(&pbVar4->m_worldTransform);
    this_00 = btMatrix3x3::operator[](pbVar6,2);
    pbVar8 = btVector3::operator_cast_to_float_(this_00);
    iVar3 = getRightAxis(in_RDI);
    btVector3::btVector3(&local_68,pbVar5->m_floats,pbVar7->m_floats,pbVar8 + iVar3);
    plVar1 = local_10;
    bVar9 = operator+(pbVar7,pbVar5);
    local_70 = bVar9.m_floats._8_8_;
    local_78 = bVar9.m_floats._0_8_;
    (**(code **)(*plVar1 + 0x20))(plVar1,&local_58,&local_78,&local_24);
    plVar1 = local_10;
    pbVar4 = getWheelInfo(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20))
    ;
    (**(code **)(*plVar1 + 0x20))
              (plVar1,&local_58,&(pbVar4->m_raycastInfo).m_contactPointWS,&local_24);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void	btRaycastVehicle::debugDraw(btIDebugDraw* debugDrawer)
{

	for (int v=0;v<this->getNumWheels();v++)
	{
		btVector3 wheelColor(0,1,1);
		if (getWheelInfo(v).m_raycastInfo.m_isInContact)
		{
			wheelColor.setValue(0,0,1);
		} else
		{
			wheelColor.setValue(1,0,1);
		}

		btVector3 wheelPosWS = getWheelInfo(v).m_worldTransform.getOrigin();

		btVector3 axle = btVector3(	
			getWheelInfo(v).m_worldTransform.getBasis()[0][getRightAxis()],
			getWheelInfo(v).m_worldTransform.getBasis()[1][getRightAxis()],
			getWheelInfo(v).m_worldTransform.getBasis()[2][getRightAxis()]);

		//debug wheels (cylinders)
		debugDrawer->drawLine(wheelPosWS,wheelPosWS+axle,wheelColor);
		debugDrawer->drawLine(wheelPosWS,getWheelInfo(v).m_raycastInfo.m_contactPointWS,wheelColor);

	}
}